

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

map_index_t __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::BucketNumber
          (KeyMapBase<unsigned_int> *this,ViewType k)

{
  NodeBase *pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  map_index_t mVar5;
  map_index_t extraout_EAX;
  map_index_t extraout_EAX_00;
  map_index_t extraout_EAX_01;
  map_index_t extraout_EAX_02;
  TableEntryPtr *pTVar6;
  MixingHashState MVar7;
  TreeIterator *it;
  NodeBase *node;
  ulong *extraout_RDX;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  ulong *puVar11;
  NodeBase *node_00;
  UntypedMapBase *pUVar12;
  KeyMapBase<unsigned_int> *pKVar13;
  NodeAndBucket NVar14;
  NodeBase aNStack_a8 [2];
  UntypedMapBase *pUStack_98;
  TableEntryPtr *pTStack_90;
  UntypedMapBase UStack_80;
  KeyMapBase<unsigned_int> KStack_60;
  undefined8 uStack_40;
  
  it = (TreeIterator *)(ulong)k;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                 (ulong)((this->super_UntypedMapBase).seed_ ^ k);
  uVar8 = (this->super_UntypedMapBase).num_buckets_ - 1 &
          (SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
          SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),0));
  uStack_40 = 0x29d46a;
  mVar5 = UntypedMapBase::VariantBucketNumber
                    (&this->super_UntypedMapBase,(VariantKey)(ZEXT416(k) << 0x40));
  if (uVar8 == mVar5) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                   (ulong)(k ^ (this->super_UntypedMapBase).seed_);
    return (SUB164(auVar3 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB164(auVar3 * ZEXT816(0x9ddfea08eb382d69),8)) &
           (this->super_UntypedMapBase).num_buckets_ - 1;
  }
  pUVar12 = (UntypedMapBase *)(ulong)uVar8;
  puVar9 = (uint *)(ulong)mVar5;
  uStack_40 = 0x29d4a1;
  BucketNumber();
  uStack_40 = 0x9ddfea08eb382d69;
  pKVar13 = &KStack_60;
  pTVar6 = (TableEntryPtr *)((ulong)puVar9 & 0xffffffff);
  KStack_60.super_UntypedMapBase.table_ = (TableEntryPtr *)this;
  KStack_60.super_UntypedMapBase.alloc_.arena_ = (Arena *)(ulong)k;
  if ((pUVar12->index_of_first_non_null_ == pUVar12->num_buckets_) ||
     (it = (TreeIterator *)pUVar12->table_, puVar10 = puVar9,
     (&it->node_)[pUVar12->index_of_first_non_null_] !=
     (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
      *)0x0)) {
    puVar10 = (uint *)(ulong)*(uint *)&node[1].next;
    UStack_80.alloc_.arena_ = (Arena *)0x29d4d8;
    NVar14 = FindHelper((KeyMapBase<unsigned_int> *)pUVar12,*(uint *)&node[1].next,
                        (TreeIterator *)0x0);
    if (NVar14.node == (NodeBase *)0x0) {
      mVar5 = (map_index_t)puVar9;
      if (pUVar12->table_[(long)pTVar6] == 0) {
        UStack_80.alloc_.arena_ = (Arena *)0x29d528;
        UntypedMapBase::InsertUniqueInList(pUVar12,mVar5,node);
        uVar8 = pUVar12->index_of_first_non_null_;
        if (uVar8 < mVar5) {
          mVar5 = uVar8;
        }
        pUVar12->index_of_first_non_null_ = mVar5;
        return uVar8;
      }
      if ((pUVar12->table_[(long)pTVar6] & 1) == 0) {
        UStack_80.alloc_.arena_ = (Arena *)0x29d4fa;
        bVar4 = UntypedMapBase::TableEntryIsTooLong(pUVar12,mVar5);
        if (!bVar4) {
          UntypedMapBase::InsertUniqueInList(pUVar12,mVar5,node);
          return extraout_EAX_00;
        }
      }
      UntypedMapBase::InsertUniqueInTree(pUVar12,mVar5,NodeToVariantKey,node);
      return extraout_EAX;
    }
    UStack_80.alloc_.arena_ = (Arena *)0x29d55d;
    InsertUnique(&KStack_60);
  }
  UStack_80.alloc_.arena_ = (Arena *)0x29d565;
  InsertUnique(&KStack_60);
  uVar8 = (pKVar13->super_UntypedMapBase).num_buckets_ - 1 & *puVar10;
  *puVar10 = uVar8;
  UStack_80.table_ = pTVar6;
  UStack_80.alloc_.arena_ = (Arena *)pUVar12;
  if (((ulong)extraout_RDX & 1) != 0) {
    pUVar12 = &UStack_80;
    pTStack_90 = (TableEntryPtr *)0x29d5e5;
    revalidate_if_necessary();
    pTStack_90 = pTVar6;
    if (pUVar12->num_buckets_ == 1) {
      pUVar12->index_of_first_non_null_ = 2;
      pUVar12->num_buckets_ = 2;
      pTVar6 = UntypedMapBase::CreateEmptyTable(pUVar12,2);
      pUVar12->table_ = pTVar6;
      aNStack_a8[0].next = (NodeBase *)rdtsc();
      pUStack_98 = pUVar12;
      MVar7 = absl::lts_20240722::hash_internal::
              HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
              combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                        ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed
                         ,(unsigned_long *)aNStack_a8,&pUVar12->table_,&pUStack_98);
      mVar5 = (map_index_t)MVar7.state_;
      pUVar12->seed_ = mVar5;
    }
    else {
      if ((uint)puVar10 < 2) {
        node_00 = aNStack_a8;
        pKVar13 = (KeyMapBase<unsigned_int> *)((ulong)puVar10 & 0xffffffff);
        Resize();
        do {
          pNVar1 = node_00->next;
          mVar5 = BucketNumber(pKVar13,*(ViewType *)&node_00[1].next);
          InsertUnique(pKVar13,mVar5,(KeyNode *)node_00);
          node_00 = pNVar1;
        } while (pNVar1 != (NodeBase *)0x0);
        return extraout_EAX_02;
      }
      Resize();
      mVar5 = extraout_EAX_01;
    }
    return mVar5;
  }
  puVar11 = (ulong *)(pKVar13->super_UntypedMapBase).table_[uVar8];
  mVar5 = (map_index_t)CONCAT71((uint7)(uint3)(uVar8 >> 8),1);
  if (puVar11 != extraout_RDX) {
    if (((ulong)puVar11 & 1) == 0 && puVar11 != (ulong *)0x0) {
      do {
        puVar11 = (ulong *)*puVar11;
        if (puVar11 == extraout_RDX) break;
      } while (puVar11 != (ulong *)0x0);
      if (puVar11 != (ulong *)0x0) {
        return mVar5;
      }
    }
    pTStack_90 = (TableEntryPtr *)0x29d5c3;
    NVar14 = FindHelper(pKVar13,(ViewType)extraout_RDX[1],it);
    *puVar10 = NVar14.bucket;
    pTVar6 = (pKVar13->super_UntypedMapBase).table_;
    mVar5 = (map_index_t)CONCAT71((int7)((ulong)pTVar6 >> 8),(pTVar6[NVar14.bucket] & 1) == 0);
  }
  return mVar5;
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }